

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O3

grid_split * idx2::SplitAlternate(grid_split *__return_storage_ptr__,grid *Grid,dimension D)

{
  int *piVar1;
  int iVar2;
  u64 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  v3i Mask3;
  v3i NewStrd3;
  undefined8 local_50;
  uint local_48;
  undefined8 local_40;
  int local_38;
  undefined8 local_30;
  int local_28;
  ulong local_20;
  int local_18;
  ulong local_10;
  uint local_8;
  
  uVar3 = (Grid->super_extent).Dims;
  local_10 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_8 = (uint)((long)(uVar3 * 2) >> 0x2b);
  uVar3 = Grid->Strd;
  local_20 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_18 = (int)((long)(uVar3 * 2) >> 0x2b);
  uVar3 = (Grid->super_extent).From;
  local_30 = (long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U |
             (ulong)(uint)((long)(uVar3 << 0x2b) >> 0x2b);
  local_28 = (int)((long)(uVar3 * 2) >> 0x2b);
  if ((int)D < 3) {
    lVar10 = (long)(int)D;
    piVar1 = (int *)((long)&local_30 + lVar10 * 4);
    *piVar1 = *piVar1 + *(int *)((long)&local_20 + lVar10 * 4);
    (__return_storage_ptr__->First).super_extent.From = (Grid->super_extent).From;
    local_48 = local_8;
    local_50 = local_10;
    iVar2 = *(int *)((long)&local_10 + lVar10 * 4);
    iVar11 = iVar2 + 1 >> 1;
    *(int *)((long)&local_50 + lVar10 * 4) = iVar11;
    uVar9 = local_48;
    uVar7 = (uint)local_50;
    uVar8 = local_50._4_4_;
    local_38 = local_18;
    local_40 = local_20;
    piVar1 = (int *)((long)&local_40 + lVar10 * 4);
    *piVar1 = *piVar1 << 1;
    *(int *)((long)&local_50 + lVar10 * 4) = iVar2 - iVar11;
    auVar4 = vpinsrd_avx(ZEXT416(uVar7),(undefined4)local_40,1);
    auVar5 = vpinsrd_avx(ZEXT416(uVar8),local_40._4_4_,1);
    auVar6 = vpinsrd_avx(ZEXT416(uVar9),local_38,1);
    auVar4 = vpinsrd_avx(auVar4,(undefined4)local_30,2);
    auVar4 = vpinsrd_avx(auVar4,(uint)local_50,3);
    auVar14._8_4_ = 0x1fffff;
    auVar14._0_8_ = 0x1fffff001fffff;
    auVar14._12_4_ = 0x1fffff;
    auVar4 = vpand_avx(auVar4,auVar14);
    auVar13 = vpmovzxdq_avx2(auVar4);
    auVar4 = vpinsrd_avx(auVar5,local_30._4_4_,2);
    auVar4 = vpinsrd_avx(auVar4,local_50._4_4_,3);
    auVar4 = vpand_avx(auVar4,auVar14);
    auVar12 = vpmovzxdq_avx2(auVar4);
    auVar12 = vpsllq_avx2(auVar12,0x15);
    auVar12 = vpor_avx2(auVar12,auVar13);
    auVar4 = vpinsrd_avx(auVar6,local_28,2);
    auVar4 = vpinsrd_avx(auVar4,local_48,3);
    auVar4 = vpand_avx(auVar4,auVar14);
    auVar13 = vpmovzxdq_avx2(auVar4);
    auVar13 = vpsllq_avx2(auVar13,0x2a);
    auVar13 = vpor_avx2(auVar12,auVar13);
    uVar3 = vpextrq_avx(auVar13._0_16_,1);
    (__return_storage_ptr__->Second).Strd = uVar3;
    *(undefined1 (*) [32])&(__return_storage_ptr__->First).super_extent.Dims = auVar13;
    return __return_storage_ptr__;
  }
  __assert_fail("Idx < 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
}

Assistant:

grid_split
SplitAlternate(const grid& Grid, dimension D)
{
  v3i Dims3 = Dims(Grid);
  v3i Strd3 = Strd(Grid);
  v3i From3 = From(Grid);
  From3[D] += Strd3[D];
  grid_split GridSplit{ Grid, Grid };
  v3i Mask3 = Dims3;
  Mask3[D] = (Dims3[D] + 1) >> 1;
  SetDims(&GridSplit.First, Mask3);
  v3i NewStrd3 = Strd3;
  NewStrd3[D] <<= 1;
  SetStrd(&GridSplit.First, NewStrd3);
  Mask3[D] = Dims3[D] - Mask3[D];
  SetDims(&GridSplit.Second, Mask3);
  SetStrd(&GridSplit.Second, NewStrd3);
  SetFrom(&GridSplit.Second, From3);
  return GridSplit;
}